

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

size_t __thiscall ON_FixedSizePool::ElementIndex(ON_FixedSizePool *this,void *element_pointer)

{
  void **ppvVar1;
  long lVar2;
  char *sFormat;
  undefined8 *puVar3;
  int line_number;
  undefined8 *puVar4;
  
  if (element_pointer != (void *)0x0) {
    if ((undefined8 *)this->m_first_block != (undefined8 *)0x0) {
      lVar2 = 0;
      puVar3 = (undefined8 *)this->m_first_block;
      do {
        if (puVar3 == (undefined8 *)this->m_al_block) {
          puVar4 = (undefined8 *)0x0;
          ppvVar1 = &this->m_al_element_array;
        }
        else {
          puVar4 = (undefined8 *)*puVar3;
          ppvVar1 = (void **)(puVar3 + 1);
        }
        puVar3 = puVar3 + 2;
        if (element_pointer < *ppvVar1 && puVar3 <= element_pointer) {
          if ((ulong)((long)element_pointer - (long)puVar3) % this->m_sizeof_element == 0) {
            return ((ulong)((long)element_pointer - (long)puVar3) / this->m_sizeof_element &
                   0xffffffff) + lVar2;
          }
          sFormat = "element_pointer is offset into an fsp element.";
          line_number = 0x356;
          goto LAB_00491a8b;
        }
        lVar2 = lVar2 + (ulong)((long)*ppvVar1 - (long)puVar3) / this->m_sizeof_element;
        puVar3 = puVar4;
      } while (puVar4 != (undefined8 *)0x0);
    }
    sFormat = "element_pointer is not in allocated fsp memory.";
    line_number = 0x35d;
LAB_00491a8b:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,line_number,"",sFormat);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t ON_FixedSizePool::ElementIndex(const void* element_pointer) const
{
  if (nullptr != element_pointer)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;
    const char* ptr = (const char*)element_pointer;
    size_t ptr_index = 0;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
      {
        size_t offset = ptr - block;
        if (0 == offset % m_sizeof_element)
        {
          ptr_index += (unsigned int)(offset/m_sizeof_element);
          return ptr_index;
        }
        // Caller is confused
        ON_ERROR("element_pointer is offset into an fsp element.");
        return ON_MAX_SIZE_T;
      }
      block_count = (block_end - block) / m_sizeof_element;
      ptr_index += block_count;
    }
    // Caller is confused
    ON_ERROR("element_pointer is not in allocated fsp memory.");
    return ON_MAX_SIZE_T;
  }

  return ON_MAX_SIZE_T;
}